

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

void assignment(LexState *ls,LHS_assign *lh,int nvars)

{
  byte bVar1;
  bool bVar2;
  int nexps;
  LHS_assign *pLVar3;
  FuncState *pFVar4;
  FuncState *fs;
  expdesc e;
  undefined1 local_40 [8];
  expdesc local_38;
  
  if (2 < (lh->v).k - VLOCAL) {
    luaX_syntaxerror(ls,"syntax error");
  }
  if ((ls->t).token == 0x2c) {
    luaX_next(ls);
    local_40 = (undefined1  [8])lh;
    suffixedexp(ls,&local_38);
    if (local_38.k != VINDEXED) {
      pFVar4 = ls->fs;
      bVar1 = pFVar4->freereg;
      bVar2 = false;
      pLVar3 = lh;
      do {
        while ((pLVar3->v).k != VINDEXED) {
LAB_0011514a:
          pLVar3 = pLVar3->prev;
          if (pLVar3 == (LHS_assign *)0x0) {
            if (!bVar2) goto LAB_0011517d;
            goto LAB_00115156;
          }
        }
        if ((local_38.k == (pLVar3->v).u.ind.vt) && (local_38.u.info == (uint)(pLVar3->v).u.ind.t))
        {
          (pLVar3->v).u.ind.vt = '\b';
          (pLVar3->v).u.ind.t = bVar1;
          bVar2 = true;
        }
        if ((local_38.k != VLOCAL) || (local_38.u.info != (pLVar3->v).u.ind.idx)) goto LAB_0011514a;
        *(ushort *)&(pLVar3->v).u = (ushort)bVar1;
        pLVar3 = pLVar3->prev;
        bVar2 = true;
      } while (pLVar3 != (LHS_assign *)0x0);
LAB_00115156:
      luaK_codeABC(pFVar4,(uint)(local_38.k != VLOCAL) * 5,(uint)bVar1,local_38.u.info,0);
      luaK_reserveregs(pFVar4,1);
    }
LAB_0011517d:
    if (200 < (int)((uint)ls->L->nCcalls + nvars)) {
      errorlimit(ls->fs,200,"C levels");
    }
    assignment(ls,(LHS_assign *)local_40,nvars + 1);
  }
  else {
    checknext(ls,0x3d);
    nexps = explist(ls,(expdesc *)local_40);
    if (nexps == nvars) {
      luaK_setoneret(ls->fs,(expdesc *)local_40);
      pFVar4 = ls->fs;
      goto LAB_0011520a;
    }
    adjust_assign(ls,nvars,nexps,(expdesc *)local_40);
  }
  pFVar4 = ls->fs;
  local_38.k = pFVar4->freereg - VNIL;
  local_38.u.ival = -1;
  local_40._0_4_ = 7;
LAB_0011520a:
  luaK_storevar(pFVar4,&lh->v,(expdesc *)local_40);
  return;
}

Assistant:

static void assignment(LexState *ls, struct LHS_assign *lh, int nvars) {
    expdesc e;
    check_condition(ls, vkisvar(lh->v.k), "syntax error");
    if (testnext(ls, ',')) {  /* assignment -> ',' suffixedexp assignment */
        struct LHS_assign nv;
        nv.prev = lh;
        suffixedexp(ls, &nv.v);
        if (nv.v.k != VINDEXED)
            check_conflict(ls, lh, &nv.v);
        checklimit(ls->fs, nvars + ls->L->nCcalls, LUAI_MAXCCALLS,
                   "C levels");
        assignment(ls, &nv, nvars + 1);
    } else {  /* assignment -> '=' explist */
        int nexps;
        checknext(ls, '=');
        nexps = explist(ls, &e);
        if (nexps != nvars)
            adjust_assign(ls, nvars, nexps, &e);
        else {
            luaK_setoneret(ls->fs, &e);  /* close last expression */
            luaK_storevar(ls->fs, &lh->v, &e);
            return;  /* avoid default */
        }
    }
    init_exp(&e, VNONRELOC, ls->fs->freereg - 1);  /* default assignment */
    luaK_storevar(ls->fs, &lh->v, &e);
}